

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O2

void __thiscall
sisl::array_n<bool,_2,_std::allocator<bool>_>::array_n
          (array_n<bool,_2,_std::allocator<bool>_> *this,
          array_n<bool,_2,_std::allocator<bool>_> *obj)

{
  uint uVar1;
  long lVar2;
  uint n;
  
  n = 1;
  for (lVar2 = 2; lVar2 != 4; lVar2 = lVar2 + 1) {
    uVar1 = obj->_dims[lVar2 + -2];
    this->_dims[lVar2 + -2] = uVar1;
    n = n * uVar1;
  }
  _alloc(this,n);
  memcpy(this->_array,obj->_array,(ulong)n);
  return;
}

Assistant:

array_n(const array_n &obj) {
            unsigned int n = 1;

            // Copy dims
            for(int i = 0; i < N; i++) {
                _dims[i] = obj._dims[i];
                n *= _dims[i];
            }

            // Allocate for ourselves
            _alloc(n);

            // Copy everything to our array
            memcpy(_array, obj._array, n*sizeof(T));
#ifdef SISL_CL
            _onDevice = false;
            _deviceMemory = nullptr;
#endif
        }